

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component_icon.cpp
# Opt level: O2

ComponentIcon * lsim::gui::ComponentIcon::cache(uint32_t id,char *data,size_t len)

{
  __uniq_ptr_impl<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_> __p;
  __uniq_ptr_impl<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_> *this;
  ComponentIcon *pCVar1;
  key_type local_24;
  __uniq_ptr_impl<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>
  local_20 [2];
  unsigned_long local_10;
  
  std::make_unique<lsim::gui::ComponentIcon,char_const*&,unsigned_long&>
            ((char **)local_20,&local_10);
  this = (__uniq_ptr_impl<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>
          *)std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)m_icon_cache,&local_24);
  __p._M_t.
  super__Tuple_impl<0UL,_lsim::gui::ComponentIcon_*,_std::default_delete<lsim::gui::ComponentIcon>_>
  .super__Head_base<0UL,_lsim::gui::ComponentIcon_*,_false>._M_head_impl =
       local_20[0]._M_t.
       super__Tuple_impl<0UL,_lsim::gui::ComponentIcon_*,_std::default_delete<lsim::gui::ComponentIcon>_>
       .super__Head_base<0UL,_lsim::gui::ComponentIcon_*,_false>._M_head_impl;
  local_20[0]._M_t.
  super__Tuple_impl<0UL,_lsim::gui::ComponentIcon_*,_std::default_delete<lsim::gui::ComponentIcon>_>
  .super__Head_base<0UL,_lsim::gui::ComponentIcon_*,_false>._M_head_impl =
       (tuple<lsim::gui::ComponentIcon_*,_std::default_delete<lsim::gui::ComponentIcon>_>)
       (_Tuple_impl<0UL,_lsim::gui::ComponentIcon_*,_std::default_delete<lsim::gui::ComponentIcon>_>
       )0x0;
  std::__uniq_ptr_impl<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>::
  reset(this,(pointer)__p._M_t.
                      super__Tuple_impl<0UL,_lsim::gui::ComponentIcon_*,_std::default_delete<lsim::gui::ComponentIcon>_>
                      .super__Head_base<0UL,_lsim::gui::ComponentIcon_*,_false>._M_head_impl);
  std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>::
  ~unique_ptr((unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>
               *)local_20);
  pCVar1 = cached(0);
  return pCVar1;
}

Assistant:

ComponentIcon* ComponentIcon::cache(uint32_t id, const char* data, size_t len) {
	m_icon_cache[id] = std::make_unique<ComponentIcon>(data, len);
	return cached(id);
}